

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

__pid_t __thiscall TadsMessageQueue::wait(TadsMessageQueue *this,void *__stat_loc)

{
  TadsMessage *pTVar1;
  undefined8 *in_RDX;
  unsigned_long in_stack_00000040;
  OS_Waitable **in_stack_00000048;
  int ret;
  OS_Event *brkevt;
  int cnt;
  OS_Waitable *w [3];
  TadsMessageQueue *in_stack_ffffffffffffff70;
  OS_Waitable *local_70;
  OS_Waitable *local_58;
  int local_4c;
  OS_Waitable *local_38 [4];
  undefined8 *local_18;
  void *local_10;
  TadsMessageQueue *local_8;
  
  *in_RDX = 0;
  local_58 = (OS_Waitable *)0x0;
  if (this->ev != (OS_Event *)0x0) {
    local_58 = &this->ev->super_OS_Waitable;
  }
  local_38[0] = local_58;
  if (this->quit_evt != (OS_Event *)0x0) {
    local_70 = (OS_Waitable *)0x0;
    if (this->quit_evt != (OS_Event *)0x0) {
      local_70 = &this->quit_evt->super_OS_Waitable;
    }
    local_38[1] = local_70;
  }
  local_18 = in_RDX;
  local_10 = __stat_loc;
  local_8 = this;
  local_4c = OS_Waitable::multi_wait(brkevt._4_4_,in_stack_00000048,in_stack_00000040);
  if (local_4c == 0) {
    pTVar1 = get(in_stack_ffffffffffffff70);
    *local_18 = pTVar1;
  }
  if (local_38[local_4c] == (OS_Waitable *)0x0) {
    local_4c = 2;
  }
  return local_4c;
}

Assistant:

int TadsMessageQueue::wait(VMG_ unsigned long timeout, TadsMessage **msgp)
{
    /* assume we won't return a message */
    *msgp = 0;

    /* 
     *   Wait for a message to arrive in the queue.  The sender will signal
     *   our event upon posting a message.  Note that our assumption that
     *   there's only one reader thread per queue means that we don't have to
     *   worry about another reader swiping the signaled message between the
     *   time the signal went off and the time we read the queue.
     *   
     *   Also stop waiting if the quit event has been signaled, or the debug
     *   event is signaled.  
     */
    OS_Waitable *w[3];
    int cnt = 0;
    w[cnt++] = ev;

    /* add the quit event, if present */
    if (quit_evt != 0)
        w[cnt++] = quit_evt;

    /* add the debug break event, if present */
    OS_Event *brkevt = 0;
    VM_IF_DEBUGGER(if (G_debugger != 0)
        w[cnt++] = brkevt = G_debugger->get_break_event());
    
    /* wait for an event */
    int ret = OS_Waitable::multi_wait(cnt, w, timeout);
    
    /* if the message event fired, retrieve the message */
    if (ret == OSWAIT_EVENT + 0)
        *msgp = get();
    
    /* 
     *   always return +2 for the debug event (we'll have +1 from the
     *   multi_wait if the list doesn't have a quit event) 
     */
    if (w[ret - OSWAIT_EVENT] == brkevt)
        ret = OSWAIT_EVENT + 2;

    /* release the debugger break event, if we got it */
    if (brkevt != 0)
        brkevt->release_ref();
    
    /* return the result */
    return ret;
}